

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

ecs_entity_t
ecs_new_system(ecs_world_t *world,ecs_entity_t e,char *name,ecs_entity_t tag,char *signature,
              ecs_iter_action_t action)

{
  char *__s1;
  int iVar1;
  ecs_entity_t entity;
  undefined8 *puVar2;
  int32_t line;
  _Bool added;
  ecs_iter_action_t local_40;
  ecs_iter_action_t local_38;
  
  local_40 = action;
  _ecs_assert(world->magic == 0x65637377,0x1a,(char *)0x0,"world->magic == ECS_WORLD_MAGIC",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0x333);
  if (world->magic != 0x65637377) {
    __assert_fail("world->magic == (0x65637377)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x333,
                  "ecs_entity_t ecs_new_system(ecs_world_t *, ecs_entity_t, const char *, ecs_entity_t, const char *, ecs_iter_action_t)"
                 );
  }
  _ecs_assert((_Bool)(world->in_progress ^ 1),0x19,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0x334);
  if (world->in_progress == true) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x334,
                  "ecs_entity_t ecs_new_system(ecs_world_t *, ecs_entity_t, const char *, ecs_entity_t, const char *, ecs_iter_action_t)"
                 );
  }
  entity = ecs_lookup_w_id(world,e,name);
  if (entity == 0) {
    entity = ecs_new_entity(world,0,name,(char *)0x0);
  }
  if (tag != 0) {
    ecs_add_entity(world,entity,tag);
  }
  added = false;
  puVar2 = (undefined8 *)ecs_get_mut_w_entity(world,entity,8,&added);
  if (added == true) {
    *puVar2 = signature;
  }
  else {
    __s1 = (char *)*puVar2;
    if (signature == (char *)0x0 || __s1 == (char *)0x0) {
      if (((__s1 != signature) && (((__s1 == (char *)0x0 || (*__s1 != '0')) || (__s1[1] != '\0'))))
         && (((signature == (char *)0x0 || (*signature != '0')) || (signature[1] != '\0')))) {
        name = (char *)0x0;
        line = 0x34b;
        goto LAB_0012d8eb;
      }
    }
    else {
      iVar1 = strcmp(__s1,signature);
      if (iVar1 != 0) {
        line = 0x350;
LAB_0012d8eb:
        _ecs_abort(0xe,name,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                   ,line);
        abort();
      }
    }
  }
  ecs_modified_w_entity(world,entity,8);
  local_38 = local_40;
  ecs_set_ptr_w_entity(world,entity,0xb,8,&local_38);
  return entity;
}

Assistant:

ecs_entity_t ecs_new_system(
    ecs_world_t *world,
    ecs_entity_t e,
    const char *name,
    ecs_entity_t tag,
    const char *signature,
    ecs_iter_action_t action)
{
    ecs_assert(world->magic == ECS_WORLD_MAGIC, ECS_INVALID_FROM_WORKER, NULL);
    ecs_assert(!world->in_progress, ECS_INVALID_WHILE_ITERATING, NULL);

    ecs_entity_t result = ecs_lookup_w_id(world, e, name);
    if (!result) {
        result = ecs_new_entity(world, 0, name, NULL);
    }

    if (tag) {
        ecs_add_entity(world, result, tag);
    }

    bool added = false;
    EcsSignatureExpr *expr = ecs_get_mut(world, result, EcsSignatureExpr, &added);
    if (added) {
        expr->expr = signature;
    } else {
        if (!expr->expr || !signature) {
            if (expr->expr != signature) {
                if (expr->expr && !strcmp(expr->expr, "0")) {
                    /* Ok */
                } else if (signature && !strcmp(signature, "0")) {
                    /* Ok */
                } else {
                    ecs_abort(ECS_ALREADY_DEFINED, NULL);
                }
            }
        } else {
            if (strcmp(expr->expr, signature)) {
                ecs_abort(ECS_ALREADY_DEFINED, name);
            }
        }
    }

    ecs_modified(world, result, EcsSignatureExpr);

    ecs_set(world, result, EcsIterAction, {action});

    return result;
}